

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_solver_utilities.cpp
# Opt level: O0

void __thiscall
solver_utilites_update_convergence_Test::TestBody(solver_utilites_update_convergence_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Scalar *pSVar3;
  type_conflict *rhs;
  type_conflict *rhs_00;
  pair<double,_double> pVar4;
  AssertHelper local_518;
  Message local_510;
  double local_508;
  undefined1 local_500 [8];
  AssertionResult gtest_ar_17;
  Message local_4e8;
  double local_4e0;
  undefined1 local_4d8 [8];
  AssertionResult gtest_ar_16;
  Message local_4c0;
  undefined1 local_4b8 [8];
  AssertionResult gtest_ar_15;
  Message local_4a0;
  undefined1 local_498 [8];
  AssertionResult gtest_ar_14;
  Message local_480;
  undefined1 local_478 [8];
  AssertionResult gtest_ar_13;
  Message local_460;
  undefined1 local_458 [8];
  AssertionResult gtest_ar_12;
  Message local_440;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_438;
  duration<long,_std::ratio<1L,_1000000000L>_> local_430;
  duration<long,_std::ratio<1L,_1000000L>_> local_428;
  undefined1 local_420 [8];
  AssertionResult gtest_ar_11;
  Message local_408;
  int local_3fc;
  undefined1 local_3f8 [8];
  AssertionResult gtest_ar_10;
  type_conflict *l_inf_norm;
  type_conflict *weighted_l2_norm;
  double local_3d0;
  double local_3c8 [5];
  initializer_list<double> local_3a0;
  Vector_Dense<double,_0UL> local_390;
  AssertHelper local_378;
  Message local_370;
  double local_368;
  undefined1 local_360 [8];
  AssertionResult gtest_ar_9;
  Message local_348;
  double local_340;
  undefined1 local_338 [8];
  AssertionResult gtest_ar_8;
  Message local_320;
  undefined1 local_318 [8];
  AssertionResult gtest_ar_7;
  Message local_300;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar_6;
  Message local_2e0;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar_5;
  Message local_2c0;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar_4;
  Message local_2a0;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_298;
  duration<long,_std::ratio<1L,_1000000000L>_> local_290;
  duration<long,_std::ratio<1L,_1000000L>_> local_288;
  undefined1 local_280 [8];
  AssertionResult gtest_ar_3;
  Message local_268;
  int local_25c;
  undefined1 local_258 [8];
  AssertionResult gtest_ar_2;
  type_conflict *l_inf_norm_0;
  type_conflict *weighted_l2_norm_0;
  double local_230;
  double local_228 [6];
  initializer_list<double> local_1f8;
  undefined1 local_1e8 [8];
  Vector_Dense<double,_0UL> constant;
  undefined1 local_1c8 [8];
  Vector_Dense<double,_0UL> solution;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [24];
  Matrix_Sparse matrix_sparse;
  Message local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_1;
  Message local_98 [3];
  int local_7c;
  undefined1 local_78 [8];
  AssertionResult gtest_ar;
  Convergence_Data data;
  time_point start_time;
  solver_utilites_update_convergence_Test *this_local;
  
  data.residual_max_normalised = (Scalar)std::chrono::_V2::steady_clock::now();
  Disa::Convergence_Data::Convergence_Data((Convergence_Data *)&gtest_ar.message_);
  local_7c = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_78,"data.iteration","0",(unsigned_long *)&data.start_time,&local_7c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(local_98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/solver/test_solver_utilities.cpp"
               ,0x21,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  testing::internal::
  CmpHelperGT<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
            ((internal *)local_b0,"data.start_time","start_time",
             (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)&data.duration,
             (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)&data.residual_max_normalised);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&matrix_sparse.column_size,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/solver/test_solver_utilities.cpp"
               ,0x22,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&matrix_sparse.column_size,&local_b8)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&matrix_sparse.column_size);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  Disa::Matrix_Sparse::Matrix_Sparse((Matrix_Sparse *)(local_120 + 0x10),5,5);
  local_140._24_8_ = (pointer)0x0;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_120,(size_t *)(local_120 + 0x10));
  local_140._16_8_ = (pointer)0x0;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_120,
                      (size_t *)(local_140 + 0x10));
  *pSVar3 = 0.5;
  local_160._24_8_ = (pointer)0x1;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_140,(size_t *)(local_120 + 0x10));
  local_160._16_8_ = (pointer)0x1;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_140,
                      (size_t *)(local_160 + 0x10));
  *pSVar3 = 0.5;
  local_180._24_8_ = (pointer)0x2;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_160,(size_t *)(local_120 + 0x10));
  local_180._16_8_ = (pointer)0x2;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_160,
                      (size_t *)(local_180 + 0x10));
  *pSVar3 = 0.5;
  local_1a0._24_8_ = (pointer)0x3;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_180,(size_t *)(local_120 + 0x10));
  local_1a0._16_8_ = (pointer)0x3;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_180,
                      (size_t *)(local_1a0 + 0x10));
  *pSVar3 = 0.5;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_1a0,(size_t *)(local_120 + 0x10));
  solution.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x4;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_1a0,
                      (size_t *)
                      &solution.super_vector<double,_std::allocator<double>_>.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  *pSVar3 = 0.5;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense((Vector_Dense<double,_0UL> *)local_1c8);
  constant.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x4000000000000000;
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)local_1c8,5,
             (value_type_conflict2 *)
             &constant.super_vector<double,_std::allocator<double>_>.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  local_228[2] = 3.0;
  local_228[3] = -1.0;
  local_228[0] = 3.0;
  local_228[1] = -1.0;
  local_228[4] = 3.0;
  local_1f8._M_array = local_228;
  local_1f8._M_len = 5;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense((Vector_Dense<double,_0UL> *)local_1e8,&local_1f8);
  pVar4 = Disa::compute_residual<Disa::Matrix_Sparse,Disa::Vector_Dense<double,0ul>>
                    ((Matrix_Sparse *)(local_120 + 0x10),(Vector_Dense<double,_0UL> *)local_1c8,
                     (Vector_Dense<double,_0UL> *)local_1e8);
  local_230 = pVar4.second;
  weighted_l2_norm_0 = (type_conflict *)pVar4.first;
  rhs = std::get<0ul,double,double>((pair<double,_double> *)&weighted_l2_norm_0);
  gtest_ar_2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )std::get<1ul,double,double>((pair<double,_double> *)&weighted_l2_norm_0);
  Disa::Convergence_Data::update<Disa::Matrix_Sparse,Disa::Vector_Dense<double,0ul>>
            ((Convergence_Data *)&gtest_ar.message_,(Matrix_Sparse *)(local_120 + 0x10),
             (Vector_Dense<double,_0UL> *)local_1c8,(Vector_Dense<double,_0UL> *)local_1e8);
  local_25c = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_258,"data.iteration","1",(unsigned_long *)&data.start_time,&local_25c
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
  if (!bVar1) {
    testing::Message::Message(&local_268);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_258);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/solver/test_solver_utilities.cpp"
               ,0x32,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_268);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
  local_298.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  local_290.__r =
       (rep)std::chrono::operator-
                      (&local_298,
                       (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&data.residual_max_normalised);
  local_288.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                      (&local_290);
  testing::internal::
  CmpHelperLE<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::chrono::duration<long,std::ratio<1l,1000000l>>>
            ((internal *)local_280,"data.duration",
             "std::chrono::duration_cast<std::chrono::microseconds>(std::chrono::steady_clock::now() - start_time)"
             ,(duration<long,_std::ratio<1L,_1000000L>_> *)&data,&local_288);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
  if (!bVar1) {
    testing::Message::Message(&local_2a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_280);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/solver/test_solver_utilities.cpp"
               ,0x34,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_2a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_2a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_2b8,"data.residual","weighted_l2_norm_0",(double *)&data.iteration,
             rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
  if (!bVar1) {
    testing::Message::Message(&local_2c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/solver/test_solver_utilities.cpp"
               ,0x35,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_2c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_2d8,"data.residual_max","l_inf_norm_0",&data.residual_normalised,
             (double *)
             gtest_ar_2.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
  if (!bVar1) {
    testing::Message::Message(&local_2e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/solver/test_solver_utilities.cpp"
               ,0x36,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_2e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_2e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_2f8,"data.residual_0","weighted_l2_norm_0",&data.residual,rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
  if (!bVar1) {
    testing::Message::Message(&local_300);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/solver/test_solver_utilities.cpp"
               ,0x37,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_300);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_318,"data.residual_max_0","l_inf_norm_0",&data.residual_max,
             (double *)
             gtest_ar_2.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_318);
  if (!bVar1) {
    testing::Message::Message(&local_320);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_318);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/solver/test_solver_utilities.cpp"
               ,0x38,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_320);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_320);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
  local_340 = 1.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_338,"data.residual_normalised","1.0",&data.residual_0,&local_340);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_338);
  if (!bVar1) {
    testing::Message::Message(&local_348);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_338);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/solver/test_solver_utilities.cpp"
               ,0x39,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_348);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_348);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
  local_368 = 1.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_360,"data.residual_max_normalised","1.0",&data.residual_max_0,
             &local_368);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
  if (!bVar1) {
    testing::Message::Message(&local_370);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_360);
    testing::internal::AssertHelper::AssertHelper
              (&local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/solver/test_solver_utilities.cpp"
               ,0x3a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_378,&local_370);
    testing::internal::AssertHelper::~AssertHelper(&local_378);
    testing::Message::~Message(&local_370);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
  local_3c8[4] = 2.0;
  local_3c8[2] = 3.0;
  local_3c8[3] = 0.0;
  local_3c8[0] = 2.0;
  local_3c8[1] = 0.0;
  local_3a0._M_array = local_3c8;
  local_3a0._M_len = 5;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense(&local_390,&local_3a0);
  Disa::Vector_Dense<double,_0UL>::operator=((Vector_Dense<double,_0UL> *)local_1e8,&local_390);
  Disa::Vector_Dense<double,_0UL>::~Vector_Dense(&local_390);
  pVar4 = Disa::compute_residual<Disa::Matrix_Sparse,Disa::Vector_Dense<double,0ul>>
                    ((Matrix_Sparse *)(local_120 + 0x10),(Vector_Dense<double,_0UL> *)local_1c8,
                     (Vector_Dense<double,_0UL> *)local_1e8);
  local_3d0 = pVar4.second;
  weighted_l2_norm = (type_conflict *)pVar4.first;
  rhs_00 = std::get<0ul,double,double>((pair<double,_double> *)&weighted_l2_norm);
  gtest_ar_10.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )std::get<1ul,double,double>((pair<double,_double> *)&weighted_l2_norm);
  Disa::Convergence_Data::update<Disa::Matrix_Sparse,Disa::Vector_Dense<double,0ul>>
            ((Convergence_Data *)&gtest_ar.message_,(Matrix_Sparse *)(local_120 + 0x10),
             (Vector_Dense<double,_0UL> *)local_1c8,(Vector_Dense<double,_0UL> *)local_1e8);
  local_3fc = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_3f8,"data.iteration","2",(unsigned_long *)&data.start_time,&local_3fc
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f8);
  if (!bVar1) {
    testing::Message::Message(&local_408);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/solver/test_solver_utilities.cpp"
               ,0x41,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_408);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_408);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f8);
  local_438.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  local_430.__r =
       (rep)std::chrono::operator-
                      (&local_438,
                       (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&data.residual_max_normalised);
  local_428.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                      (&local_430);
  testing::internal::
  CmpHelperLE<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::chrono::duration<long,std::ratio<1l,1000000l>>>
            ((internal *)local_420,"data.duration",
             "std::chrono::duration_cast<std::chrono::microseconds>(std::chrono::steady_clock::now() - start_time)"
             ,(duration<long,_std::ratio<1L,_1000000L>_> *)&data,&local_428);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
  if (!bVar1) {
    testing::Message::Message(&local_440);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_420);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/solver/test_solver_utilities.cpp"
               ,0x43,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_440);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_420);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_458,"data.residual","weighted_l2_norm",(double *)&data.iteration,
             rhs_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_458);
  if (!bVar1) {
    testing::Message::Message(&local_460);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_458);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/solver/test_solver_utilities.cpp"
               ,0x44,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_460);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_460);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_458);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_478,"data.residual_max","l_inf_norm",&data.residual_normalised,
             (double *)
             gtest_ar_10.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_478);
  if (!bVar1) {
    testing::Message::Message(&local_480);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_478);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/solver/test_solver_utilities.cpp"
               ,0x45,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_480);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_480);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_478);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_498,"data.residual_0","weighted_l2_norm_0",&data.residual,rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_498);
  if (!bVar1) {
    testing::Message::Message(&local_4a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_498);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/solver/test_solver_utilities.cpp"
               ,0x46,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_4a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_4a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_498);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_4b8,"data.residual_max_0","l_inf_norm_0",&data.residual_max,
             (double *)
             gtest_ar_2.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b8);
  if (!bVar1) {
    testing::Message::Message(&local_4c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/solver/test_solver_utilities.cpp"
               ,0x47,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_4c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_4c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b8);
  local_4e0 = *rhs_00 / *rhs;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_4d8,"data.residual_normalised",
             "weighted_l2_norm / weighted_l2_norm_0",&data.residual_0,&local_4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d8);
  if (!bVar1) {
    testing::Message::Message(&local_4e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/solver/test_solver_utilities.cpp"
               ,0x48,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_4e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_4e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d8);
  local_508 = *(double *)
               gtest_ar_10.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl /
              *(double *)
               gtest_ar_2.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_500,"data.residual_max_normalised","l_inf_norm / l_inf_norm_0",
             &data.residual_max_0,&local_508);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
  if (!bVar1) {
    testing::Message::Message(&local_510);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_500);
    testing::internal::AssertHelper::AssertHelper
              (&local_518,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/solver/test_solver_utilities.cpp"
               ,0x49,pcVar2);
    testing::internal::AssertHelper::operator=(&local_518,&local_510);
    testing::internal::AssertHelper::~AssertHelper(&local_518);
    testing::Message::~Message(&local_510);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
  Disa::Vector_Dense<double,_0UL>::~Vector_Dense((Vector_Dense<double,_0UL> *)local_1e8);
  Disa::Vector_Dense<double,_0UL>::~Vector_Dense((Vector_Dense<double,_0UL> *)local_1c8);
  Disa::Matrix_Sparse::~Matrix_Sparse((Matrix_Sparse *)(local_120 + 0x10));
  return;
}

Assistant:

TEST(solver_utilites, update_convergence) {

  auto start_time = std::chrono::steady_clock::now();
  Convergence_Data data;
  // Test that which must be correct after instantiation.
  EXPECT_EQ(data.iteration, 0);
  EXPECT_GT(data.start_time, start_time);

  // construct system
  Matrix_Sparse matrix_sparse(5, 5);
  matrix_sparse[0][0] = 0.5;
  matrix_sparse[1][1] = 0.5;
  matrix_sparse[2][2] = 0.5;
  matrix_sparse[3][3] = 0.5;
  matrix_sparse[4][4] = 0.5;
  Vector_Dense<Scalar, 0> solution;
  solution.resize(5, 2.0);
  Vector_Dense<Scalar, 0> constant = {3.0, -1.0, 3.0, -1.0, 3.0};
  auto [weighted_l2_norm_0, l_inf_norm_0] = compute_residual(matrix_sparse, solution, constant);

  // Test that which must be correct after instantiation.
  data.update(matrix_sparse, solution, constant);
  EXPECT_EQ(data.iteration, 1);
  EXPECT_LE(data.duration,
            std::chrono::duration_cast<std::chrono::microseconds>(std::chrono::steady_clock::now() - start_time));
  EXPECT_EQ(data.residual, weighted_l2_norm_0);
  EXPECT_EQ(data.residual_max, l_inf_norm_0);
  EXPECT_EQ(data.residual_0, weighted_l2_norm_0);
  EXPECT_EQ(data.residual_max_0, l_inf_norm_0);
  EXPECT_EQ(data.residual_normalised, 1.0);
  EXPECT_EQ(data.residual_max_normalised, 1.0);

  // Second iteration, check  that which must be correct after instantiation.
  constant = Vector_Dense<Scalar, 0>({2.0, 0.0, 3.0, 0.0, 2.0});
  auto [weighted_l2_norm, l_inf_norm] = compute_residual(matrix_sparse, solution, constant);

  data.update(matrix_sparse, solution, constant);
  EXPECT_EQ(data.iteration, 2);
  EXPECT_LE(data.duration,
            std::chrono::duration_cast<std::chrono::microseconds>(std::chrono::steady_clock::now() - start_time));
  EXPECT_EQ(data.residual, weighted_l2_norm);
  EXPECT_EQ(data.residual_max, l_inf_norm);
  EXPECT_EQ(data.residual_0, weighted_l2_norm_0);
  EXPECT_EQ(data.residual_max_0, l_inf_norm_0);
  EXPECT_EQ(data.residual_normalised, weighted_l2_norm / weighted_l2_norm_0);
  EXPECT_EQ(data.residual_max_normalised, l_inf_norm / l_inf_norm_0);
}